

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O0

void par_write(CPUARMState_conflict *env,ARMCPRegInfo_conflict *ri,uint64_t value)

{
  int iVar1;
  uint64_t value_local;
  ARMCPRegInfo_conflict *ri_local;
  CPUARMState_conflict *env_local;
  
  iVar1 = arm_feature(env,0x1a);
  if (iVar1 == 0) {
    iVar1 = arm_feature(env,5);
    if (iVar1 == 0) {
      raw_write(env,ri,value & 0xfffff1ff);
    }
    else {
      raw_write(env,ri,value & 0xfffff6ff);
    }
  }
  else {
    raw_write(env,ri,value);
  }
  return;
}

Assistant:

static void par_write(CPUARMState *env, const ARMCPRegInfo *ri, uint64_t value)
{
    if (arm_feature(env, ARM_FEATURE_LPAE)) {
        raw_write(env, ri, value);
    } else if (arm_feature(env, ARM_FEATURE_V7)) {
        raw_write(env, ri, value & 0xfffff6ff);
    } else {
        raw_write(env, ri, value & 0xfffff1ff);
    }
}